

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O2

void f8n::writeTo(ostream *out,string *level,string *tag,string *message)

{
  tm *__tp;
  ostream *poVar1;
  allocator<char> local_a1;
  time_t rawtime;
  string local_98 [32];
  char buffer [64];
  
  rawtime = 0;
  time(&rawtime);
  __tp = localtime(&rawtime);
  strftime(buffer,0x40,"%T",__tp);
  std::__cxx11::string::string<std::allocator<char>>(local_98,buffer,&local_a1);
  poVar1 = std::operator<<(out,local_98);
  poVar1 = std::operator<<(poVar1," [");
  poVar1 = std::operator<<(poVar1,(string *)level);
  poVar1 = std::operator<<(poVar1,"] [");
  poVar1 = std::operator<<(poVar1,(string *)tag);
  poVar1 = std::operator<<(poVar1,"] ");
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_98);
  std::ostream::flush();
  return;
}

Assistant:

static void writeTo(
        std::ostream& out,
        const std::string& level,
        const std::string& tag,
        const std::string& message)
    {
        out << timestamp() << " [" << level << "] [" << tag << "] " << message << "\n";
        out.flush();
    }